

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O1

void TestDestroySignal(void)

{
  iterator iVar1;
  TestB *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  TestB **ppTVar4;
  vector<TestB_*,_std::allocator<TestB_*>_> *__range1;
  long lVar5;
  vector<TestB_*,_std::allocator<TestB_*>_> listeners;
  TestB *pb;
  TestA ta;
  TestB **local_b8;
  iterator iStack_b0;
  TestB **local_a8;
  TestB *local_a0;
  slot local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  connection local_48;
  
  TestRunner::StartTest("TestDestroySignal");
  local_b8 = (TestB **)0x0;
  iStack_b0._M_current = (TestB **)0x0;
  local_a8 = (TestB **)0x0;
  lsignal::slot::slot(&local_98);
  local_98._vptr_slot = (_func_int **)&PTR__TestA_0011a840;
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  local_70->_M_use_count = 1;
  local_70->_M_weak_count = 1;
  local_70->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011ab60;
  local_78 = local_70 + 1;
  local_70[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_70[4]._M_use_count = 0;
  local_70[4]._M_weak_count = 0;
  local_70[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_70[1]._M_use_count = 0;
  local_70[1]._M_weak_count = 0;
  local_70[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_70[2]._M_use_count = 0;
  local_70[2]._M_weak_count = 0;
  local_70[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_70[3]._M_use_count = 0;
  local_70[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_70[4]._M_use_count = local_70 + 4;
  local_70[4]._vptr__Sp_counted_base = (_func_int **)(local_70 + 4);
  local_70[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  lVar5 = 1000;
  do {
    this = (TestB *)operator_new(0x50);
    (this->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&this->dataA = 0;
    (this->explicitConnectionA)._vptr_connection = (_func_int **)0x0;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_slot)._vptr_slot = (_func_int **)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lsignal::slot::slot((slot *)this);
    (this->super_slot)._vptr_slot = (_func_int **)&PTR__TestB_0011a878;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a8b0;
    p_Var2[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[4]._M_use_count = 0;
    p_Var2[4]._M_weak_count = 0;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[1]._M_use_count = 0;
    p_Var2[1]._M_weak_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[3]._M_use_count = 0;
    p_Var2[3]._M_weak_count = 0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var2[4]._M_use_count = p_Var2 + 4;
    p_Var2[4]._vptr__Sp_counted_base = (_func_int **)(p_Var2 + 4);
    p_Var2[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var2;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var2 + 1);
    lsignal::connection::connection(&this->explicitConnectionA);
    local_a0 = this;
    if (iStack_b0._M_current == local_a8) {
      std::vector<TestB*,std::allocator<TestB*>>::_M_realloc_insert<TestB*const&>
                ((vector<TestB*,std::allocator<TestB*>> *)&local_b8,iStack_b0,&local_a0);
    }
    else {
      *iStack_b0._M_current = this;
      iStack_b0._M_current = iStack_b0._M_current + 1;
    }
    lsignal::signal<void(int)>::connect<TestB,TestB>
              (&local_48,&local_78,local_a0,0x10f868,(slot *)0x0);
    lsignal::connection::~connection(&local_48);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  uVar3 = 0xfffffffffffffffe;
  do {
    lsignal::connection::disconnect(&local_b8[uVar3 + 2]->explicitConnectionA);
    uVar3 = uVar3 + 2;
  } while (uVar3 < 0x3e6);
  uVar3 = 0xfffffffffffffffd;
  do {
    if (local_b8[uVar3 + 3] != (TestB *)0x0) {
      (*(local_b8[uVar3 + 3]->super_slot)._vptr_slot[1])();
    }
    local_b8[uVar3 + 3] = (TestB *)0x0;
    uVar3 = uVar3 + 3;
  } while (uVar3 < 0x3e5);
  local_98._vptr_slot = (_func_int **)&PTR__TestA_0011a840;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  lsignal::slot::~slot(&local_98);
  iVar1._M_current = iStack_b0._M_current;
  for (ppTVar4 = local_b8; ppTVar4 != iVar1._M_current; ppTVar4 = ppTVar4 + 1) {
    if (*ppTVar4 != (TestB *)0x0) {
      (*((*ppTVar4)->super_slot)._vptr_slot[1])();
    }
  }
  if (local_b8 != (TestB **)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return;
}

Assistant:

void TestDestroySignal()
{
	TestRunner::StartTest(MethodName);
	std::vector<TestB*> listeners;

	{
		TestA ta;
		const size_t count = 1000;
		for (size_t i = 0; i < count; i++)
		{
			TestB* pb = new TestB();
			listeners.push_back(pb);
			ta.sigA.connect(pb, &TestB::ReceiveSigA, pb);
		}

		for (size_t i = 0; i < count; i += 2)
		{
			ta.sigA.disconnect(listeners[i]->explicitConnectionA);
		}

		for (size_t i = 0; i < count; i += 3)
		{
			delete listeners[i];
			listeners[i] = nullptr;
		}
	}

	for (TestB* pb : listeners)
		delete pb;
}